

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderpass.cpp
# Opt level: O0

bool RenderPassCreate(vector<RenderPass,_std::allocator<RenderPass>_> *render_passes,string *error)

{
  GLchar *__s;
  bool bVar1;
  GLenum GVar2;
  reference shader_program;
  vector<Texture,_std::allocator<Texture>_> *this;
  reference pTVar3;
  Texture *texture;
  iterator __end2;
  iterator __begin2;
  vector<Texture,_std::allocator<Texture>_> *__range2;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  RenderPass *render_pass;
  iterator __end1;
  iterator __begin1;
  vector<RenderPass,_std::allocator<RenderPass>_> *__range1;
  string *error_local;
  vector<RenderPass,_std::allocator<RenderPass>_> *render_passes_local;
  
  __end1 = std::vector<RenderPass,_std::allocator<RenderPass>_>::begin(render_passes);
  render_pass = (RenderPass *)
                std::vector<RenderPass,_std::allocator<RenderPass>_>::end(render_passes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>
                                *)&render_pass);
    if (!bVar1) {
      return true;
    }
    shader_program =
         __gnu_cxx::
         __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
         operator*(&__end1);
    __s = DefaultVertexShader;
    local_40 = shader_program;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    bVar1 = ShaderProgramCreate(&shader_program->Program,&shader_program->ShaderSource,&local_60,
                                error);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return false;
    }
    if ((local_40->IsMain & 1U) == 0) {
      (*glad_glGenFramebuffers)(1,&local_40->FBO);
      (*glad_glBindFramebuffer)(0x8d40,local_40->FBO);
      (*glad_glGenTextures)(1,&local_40->TextureId);
      (*glad_glBindTexture)(0xde1,local_40->TextureId);
      if (local_40->Width == 0) {
        __assert_fail("render_pass.Width != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x31,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (local_40->Height == 0) {
        __assert_fail("render_pass.Height != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x32,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glTexImage2D)
                (0xde1,0,0x1908,local_40->Width,local_40->Height,0,0x1908,0x1401,(void *)0x0);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,local_40->TextureId,0);
      GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
      if (GVar2 != 0x8cd5) {
        __assert_fail("glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x3d,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glBindTexture)(0xde1,0);
    }
    this = &local_40->Textures;
    __end2 = std::vector<Texture,_std::allocator<Texture>_>::begin(this);
    texture = (Texture *)std::vector<Texture,_std::allocator<Texture>_>::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>
                                       *)&texture), bVar1) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
               operator*(&__end2);
      (*glad_glGenTextures)(1,&pTVar3->Id);
      (*glad_glBindTexture)(0xde1,pTVar3->Id);
      if (pTVar3->Width == 0) {
        __assert_fail("texture.Width != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x47,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (pTVar3->Height == 0) {
        __assert_fail("texture.Height != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x48,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      if (pTVar3->Data == (uchar *)0x0) {
        __assert_fail("texture.Data",
                      "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/renderpass.cpp"
                      ,0x49,"bool RenderPassCreate(std::vector<RenderPass> &, std::string &)");
      }
      (*glad_glTexImage2D)(0xde1,0,0x1908,pTVar3->Width,pTVar3->Height,0,0x1908,0x1401,pTVar3->Data)
      ;
      (*glad_glTexParameteri)(0xde1,0x2801,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glBindTexture)(0xde1,0);
      __gnu_cxx::__normal_iterator<Texture_*,_std::vector<Texture,_std::allocator<Texture>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<RenderPass_*,_std::vector<RenderPass,_std::allocator<RenderPass>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

bool RenderPassCreate(std::vector<RenderPass>& render_passes, std::string& error) {
    for (auto& render_pass : render_passes) {
        if (!ShaderProgramCreate(render_pass.Program, render_pass.ShaderSource, DefaultVertexShader, error)) {
            return false;
        }

        if (!render_pass.IsMain) {
            glGenFramebuffers(1, &render_pass.FBO);
            glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);

            glGenTextures(1, &render_pass.TextureId);
            glBindTexture(GL_TEXTURE_2D, render_pass.TextureId);

            assert(render_pass.Width != 0);
            assert(render_pass.Height != 0);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, render_pass.Width, render_pass.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, render_pass.TextureId, 0);

            assert(glCheckFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glBindTexture(GL_TEXTURE_2D, 0);
        }

        for (Texture& texture : render_pass.Textures) {
            glGenTextures(1, &texture.Id);
            glBindTexture(GL_TEXTURE_2D, texture.Id);

            assert(texture.Width != 0);
            assert(texture.Height != 0);
            assert(texture.Data);

            glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, texture.Width, texture.Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, texture.Data);

            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glBindTexture(GL_TEXTURE_2D, 0);
        }
    }

    return true;
}